

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_ostream.cpp
# Opt level: O0

void anon_unknown.dwarf_131826::check<long_long>(longlong t)

{
  bool bVar1;
  string *lhs;
  char *message;
  AssertHelper local_228;
  Message local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar;
  ostringstream stdos;
  undefined1 local_60 [8];
  ostringstream os;
  longlong t_local;
  
  os.str_.field_2._8_8_ = t;
  pstore::exchange::export_ns::ostringstream::ostringstream((ostringstream *)local_60);
  pstore::exchange::export_ns::operator<<((ostream_base *)local_60,os.str_.field_2._8_8_);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&gtest_ar.message_);
  std::ostream::operator<<(&gtest_ar.message_,os.str_.field_2._8_8_);
  lhs = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_((ostringstream *)local_60);
  std::__cxx11::ostringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1f8,"os.str ()","stdos.str ()",lhs,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
               ,0xd8,message);
    testing::internal::AssertHelper::operator=(&local_228,&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&gtest_ar.message_);
  pstore::exchange::export_ns::ostringstream::~ostringstream((ostringstream *)local_60);
  return;
}

Assistant:

void check (T const t) {
        pstore::exchange::export_ns::ostringstream os;
        os << t;
        std::ostringstream stdos;
        stdos << t;
        EXPECT_EQ (os.str (), stdos.str ());
    }